

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::set_typical_values(PeleLM *this,bool is_restart)

{
  string *spName;
  pointer pcVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  int iVar5;
  int iVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  long *plVar7;
  double *pdVar8;
  pointer pdVar9;
  PeleLM *pPVar10;
  int d;
  uint uVar11;
  Amr *pAVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  int i_1;
  long lVar16;
  PeleLM *pPVar17;
  int i;
  double dVar18;
  Real RVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  string tvfile;
  Vector<double,_std::allocator<double>_> velMaxV;
  FArrayBox tvfab;
  ifstream tvis;
  undefined1 local_2b8 [24];
  long lStack_2a0;
  Vector<double,_std::allocator<double>_> local_298;
  BaseFab<double> local_280;
  undefined1 local_238 [16];
  pointer local_228;
  
  pdVar9 = typical_values.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  auVar3 = _DAT_0065b9b0;
  if ((this->super_NavierStokesBase).super_AmrLevel.level != 0) {
    return;
  }
  if (is_restart) {
    uVar11 = (uint)((ulong)((long)typical_values.super_vector<double,_std::allocator<double>_>.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)typical_values.super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
    pPVar17 = this;
    if (0 < (int)uVar11) {
      lVar13 = (ulong)(uVar11 & 0x7fffffff) - 1;
      auVar20._8_4_ = (int)lVar13;
      auVar20._0_8_ = lVar13;
      auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar14 = 0;
      auVar20 = auVar20 ^ _DAT_0065b9b0;
      auVar21 = _DAT_0065b9a0;
      do {
        auVar23 = auVar21 ^ auVar3;
        if ((bool)(~(auVar23._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar23._0_4_ ||
                    auVar20._4_4_ < auVar23._4_4_) & 1)) {
          pdVar9[uVar14] = -1.0;
        }
        uVar2 = -(ushort)(auVar23._12_4_ == auVar20._12_4_ && auVar20._8_4_ < auVar23._8_4_ ||
                         auVar20._12_4_ < auVar23._12_4_) ^ 0xffff;
        pPVar17 = (PeleLM *)(ulong)uVar2;
        if ((uVar2 & 1) != 0) {
          pdVar9[uVar14 + 1] = -1.0;
        }
        uVar14 = uVar14 + 2;
        lVar13 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 2;
        auVar21._8_8_ = lVar13 + 2;
      } while ((uVar11 + 1 & 0xfffffffe) != uVar14);
    }
    if (*(int *)(amrex::ParallelContext::frames + 0xc) != 0) goto LAB_00189abc;
    pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    pcVar1 = (pAVar12->restart_chkfile)._M_dataplus._M_p;
    local_238._0_8_ = (PeleLM *)&stack0xfffffffffffffdd8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar1,pcVar1 + (pAVar12->restart_chkfile)._M_string_length);
    std::__cxx11::string::append((char *)local_238);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               (local_238,(ulong)typical_values_filename_abi_cxx11_._M_dataplus._M_p
                               );
    pPVar17 = (PeleLM *)(plVar7 + 2);
    if ((PeleLM *)*plVar7 == pPVar17) {
      local_2b8._16_8_ = (pPVar17->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel;
      lStack_2a0 = plVar7[3];
      local_2b8._0_8_ = (PeleLM *)(local_2b8 + 0x10);
    }
    else {
      local_2b8._16_8_ = (pPVar17->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel;
      local_2b8._0_8_ = (PeleLM *)*plVar7;
    }
    local_2b8._8_8_ = plVar7[1];
    *plVar7 = (long)pPVar17;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((PeleLM *)local_238._0_8_ != (PeleLM *)&stack0xfffffffffffffdd8) {
      operator_delete((void *)local_238._0_8_,(long)local_228 + 1);
    }
    std::ifstream::ifstream(local_238);
    std::ifstream::open(local_238,(_Ios_Openmode)local_2b8._0_8_);
    if (*(int *)(&stack0xfffffffffffffde8 +
                (long)(((PeleLM *)(local_238._0_8_ + -0x1940))->auxDiag)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_right) == 0) {
      amrex::FArrayBox::FArrayBox((FArrayBox *)&local_280);
      amrex::FArrayBox::readFrom((FArrayBox *)&local_280,(istream *)local_238);
      lVar13 = (long)typical_values.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)typical_values.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (lVar13 != local_280.nvar) {
        amrex::Abort_host("Typical values file has wrong number of components");
        lVar13 = (long)typical_values.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)typical_values.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      pdVar9 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (0 < lVar13) {
        lVar16 = 0;
        do {
          pdVar9[lVar16] = local_280.dptr[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar13 != lVar16);
      }
      local_280._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      amrex::BaseFab<double>::clear(&local_280);
    }
    std::ifstream::~ifstream(local_238);
    pPVar17 = (PeleLM *)local_2b8._0_8_;
    if ((PeleLM *)local_2b8._0_8_ == (PeleLM *)(local_2b8 + 0x10)) goto LAB_00189abc;
    uVar14 = local_2b8._16_8_ + 1;
  }
  else {
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_238,
               (long)*(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore
                              ).super_AmrMesh.super_AmrInfo.field_0x8c + 1,
               (allocator_type *)&local_280);
    pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    if (-1 < *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
      lVar13 = -1;
      do {
        (((NavierStokesBase *)local_238._0_8_)->super_AmrLevel).geom.super_CoordSys.offset
        [lVar13 + -2] =
             *(Real *)(*(long *)((long)(pAVar12->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar13 + 1]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200);
        pAVar12 = (this->super_NavierStokesBase).super_AmrLevel.parent;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    amrex::VectorMax((Vector<double,_std::allocator<double>_> *)&local_280,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    amrex::VectorMin((Vector<double,_std::allocator<double>_> *)local_2b8,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    amrex::VectorMaxAbs(&local_298,
                        (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                        )local_238,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,0,3,0);
    pdVar9 = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar15 = local_298.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + 1;
    pdVar8 = local_298.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (pdVar15 !=
        local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish &&
        local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != local_298.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      dVar18 = *local_298.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        dVar22 = *pdVar15;
        pdVar4 = pdVar15;
        if (dVar22 <= dVar18) {
          dVar22 = dVar18;
          pdVar4 = pdVar8;
        }
        pdVar8 = pdVar4;
        pdVar15 = pdVar15 + 1;
        dVar18 = dVar22;
      } while (pdVar15 !=
               local_298.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish);
    }
    dVar18 = *pdVar8;
    if (3 < NavierStokesBase::NUM_STATE) {
      uVar11 = NavierStokesBase::NUM_STATE - 3;
      uVar14 = 0;
      do {
        dVar22 = (double)local_280._vptr_BaseFab[uVar14] -
                 (((NavierStokesBase *)local_2b8._0_8_)->super_AmrLevel).geom.super_CoordSys.offset
                 [uVar14 - 3];
        pdVar9[uVar14 + 3] = ABS(dVar22);
        if ((dVar22 == 0.0) && (!NAN(dVar22))) {
          pdVar9[uVar14 + 3] =
               ABS((double)local_280._vptr_BaseFab[uVar14] +
                   (((NavierStokesBase *)local_2b8._0_8_)->super_AmrLevel).geom.super_CoordSys.
                   offset[uVar14 - 3]) * 0.5;
        }
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
    *pdVar9 = dVar18;
    pdVar9[1] = dVar18;
    pdVar9[2] = dVar18;
    dVar18 = pdVar9[3];
    if (dVar18 <= 0.0) {
      amrex::Assert_host("typical_values[Density] > 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0x5a4,(char *)0x0);
      dVar18 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[3];
      pdVar9 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
    pdVar9[RhoH] = pdVar9[RhoH] / dVar18;
    iVar5 = first_spec;
    lVar13 = 0;
    do {
      RVar19 = typical_Y_val_min;
      if (typical_Y_val_min <= pdVar9[iVar5 + lVar13] / pdVar9[3]) {
        RVar19 = pdVar9[iVar5 + lVar13] / pdVar9[3];
      }
      pdVar9[iVar5 + lVar13] = RVar19;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 9);
    if (local_298.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (double *)0x0) {
      operator_delete(local_298.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((PeleLM *)local_2b8._0_8_ != (PeleLM *)0x0) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
    }
    if (local_280._vptr_BaseFab != (_func_int **)0x0) {
      operator_delete(local_280._vptr_BaseFab,(long)local_280.dptr - (long)local_280._vptr_BaseFab);
    }
    pPVar17 = (PeleLM *)local_238._0_8_;
    if ((PeleLM *)local_238._0_8_ == (PeleLM *)0x0) goto LAB_00189abc;
    uVar14 = (long)local_228 - local_238._0_8_;
  }
  operator_delete(pPVar17,uVar14);
LAB_00189abc:
  pPVar10 = (PeleLM *)
            typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)
      typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    do {
      spName = (string *)
               ((pPVar10->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.offset + 1);
      iVar5 = getSpeciesIdx(spName);
      if (iVar5 < 0) {
        iVar6 = std::__cxx11::string::compare((char *)spName);
        iVar5 = NavierStokesBase::Temp;
        if ((iVar6 == 0) ||
           (iVar6 = std::__cxx11::string::compare((char *)spName), iVar5 = RhoH, iVar6 == 0))
        goto LAB_00189afe;
        iVar5 = std::__cxx11::string::compare((char *)spName);
        pdVar9 = typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (iVar5 == 0) {
          lVar13 = 0;
          do {
            dVar18 = (pPVar10->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
            RVar19 = typical_Y_val_min;
            if (typical_Y_val_min <= dVar18) {
              RVar19 = dVar18;
            }
            pdVar9[lVar13] = RVar19;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
      }
      else {
        iVar5 = iVar5 + first_spec;
LAB_00189afe:
        typical_values.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [iVar5] = (pPVar10->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
      }
      pPVar17 = pPVar10;
      pPVar10 = (PeleLM *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar10);
    } while (pPVar10 !=
             (PeleLM *)&typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  update_typical_values_chem(pPVar17);
  if (NavierStokesBase::verbose != 0) {
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"Typical vals: ",0xe);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tVelocity: ",0xb);
    amrex::Print::~Print((Print *)local_238);
    lVar13 = 0;
    do {
      local_238._8_8_ = amrex::OutStream();
      local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
      *(undefined8 *)
       ((long)&tvfile._M_dataplus._M_p +
       (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
           *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
      std::ostream::_M_insert<double>
                (typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar13]);
      local_280._vptr_BaseFab._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
      amrex::Print::~Print((Print *)local_238);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tDensity: ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[3]);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tTemp:    ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[NavierStokesBase::Temp]);
    local_280._vptr_BaseFab._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    local_238._8_8_ = amrex::OutStream();
    local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
    *(undefined8 *)
     ((long)&tvfile._M_dataplus._M_p +
     (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
         *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,"\tRhoH:    ",10);
    std::ostream::_M_insert<double>
              (typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[RhoH]);
    local_280._vptr_BaseFab = (_func_int **)CONCAT71(local_280._vptr_BaseFab._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
    amrex::Print::~Print((Print *)local_238);
    lVar16 = 8;
    lVar13 = 0;
    do {
      local_238._8_8_ = amrex::OutStream();
      local_238._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_238._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdd8);
      *(undefined8 *)
       ((long)&tvfile._M_dataplus._M_p +
       (long)local_228[-3][-2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect) =
           *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,"\tY_",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,
                 *(char **)((long)spec_names_abi_cxx11_.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8),
                 *(long *)((long)&((spec_names_abi_cxx11_.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar16));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&stack0xfffffffffffffdd8,": ",2)
      ;
      std::ostream::_M_insert<double>
                (typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[first_spec + lVar13]);
      local_280._vptr_BaseFab = (_func_int **)CONCAT71(local_280._vptr_BaseFab._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&stack0xfffffffffffffdd8,(char *)&local_280,1);
      amrex::Print::~Print((Print *)local_238);
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar13 != 9);
  }
  return;
}

Assistant:

void
PeleLM::set_typical_values(bool is_restart)
{
  if (level==0)
  {
    const int nComp = typical_values.size();

    if (is_restart)
    {
      AMREX_ASSERT(nComp==NUM_STATE);

      for (int i=0; i<nComp; ++i)
        typical_values[i] = -1;

      if (ParallelDescriptor::IOProcessor())
      {
        const std::string tvfile = parent->theRestartFile() + "/" + typical_values_filename;
        std::ifstream tvis;
        tvis.open(tvfile.c_str(),std::ios::in|std::ios::binary);

        if (tvis.good())
        {
          FArrayBox tvfab;
          tvfab.readFrom(tvis);
          if (tvfab.nComp() != typical_values.size())
            amrex::Abort("Typical values file has wrong number of components");
          for (int i=0; i<typical_values.size(); ++i)
            typical_values[i] = tvfab.dataPtr()[i];
        }
      }

      ParallelDescriptor::ReduceRealMax(typical_values.dataPtr(),nComp); //FIXME: better way?
    }
    else
    {
      Vector<const MultiFab*> Slevs(parent->finestLevel()+1);

      for (int lev = 0; lev <= parent->finestLevel(); lev++)
      {
        Slevs[lev] = &(getLevel(lev).get_new_data(State_Type));
      }

      auto scaleMax = VectorMax(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMin = VectorMin(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto velMaxV = VectorMaxAbs(Slevs,FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,0);

      auto velMax = *max_element(std::begin(velMaxV), std::end(velMaxV));

      for (int i=0; i<NUM_STATE - AMREX_SPACEDIM; ++i) {
        typical_values[i + AMREX_SPACEDIM] = std::abs(scaleMax[i] - scaleMin[i]);
          if ( typical_values[i + AMREX_SPACEDIM] <= 0.0)
              typical_values[i + AMREX_SPACEDIM] = 0.5*std::abs(scaleMax[i] + scaleMin[i]);
      }

      for (int i=0; i<AMREX_SPACEDIM; ++i) {
        typical_values[i] = velMax;
      }

      AMREX_ALWAYS_ASSERT(typical_values[Density] > 0);
      typical_values[RhoH] = typical_values[RhoH] / typical_values[Density];
      for (int i=0; i<NUM_SPECIES; ++i) {
        typical_values[first_spec + i] = std::max(typical_values[first_spec + i]/typical_values[Density],
                                                  typical_Y_val_min);
      }
    }
    //
    // If typVals specified in inputs, these take precedence componentwise.
    //
    for (std::map<std::string,Real>::const_iterator it=typical_values_FileVals.begin(),
           End=typical_values_FileVals.end();
         it!=End;
         ++it)
    {
      const int idx = getSpeciesIdx(it->first);
      if (idx>=0)
      {
        typical_values[first_spec+idx] = it->second;
      }
      else
      {
        if (it->first == "Temp")
          typical_values[Temp] = it->second;
        else if (it->first == "RhoH")
          typical_values[RhoH] = it->second;
        else if (it->first == "Vel")
        {
          for (int d=0; d<AMREX_SPACEDIM; ++d)
            typical_values[d] = std::max(it->second,typical_Y_val_min);
        }
      }
    }
    update_typical_values_chem();
    if (verbose) {
       amrex::Print() << "Typical vals: " << '\n';
       amrex::Print() << "\tVelocity: ";
       for (int i=0; i<AMREX_SPACEDIM; ++i) {
         amrex::Print() << typical_values[i] << ' ';
       }
       amrex::Print() << '\n';
       amrex::Print() << "\tDensity: " << typical_values[Density] << '\n';
       amrex::Print() << "\tTemp:    " << typical_values[Temp]    << '\n';
       amrex::Print() << "\tRhoH:    " << typical_values[RhoH]    << '\n';
       for (int i=0; i<NUM_SPECIES; ++i)
       {
           amrex::Print() << "\tY_" << spec_names[i] << ": " << typical_values[first_spec+i] <<'\n';
       }
    }
  }
}